

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,TagSymbol *name)

{
  bool bVar1;
  GlobalName local_28;
  
  bVar1 = IsImport(this,(name->super_GlobalName).name);
  if (!bVar1) {
    WriteData(this,"&",1);
  }
  local_28.type = (name->super_GlobalName).type;
  local_28._4_4_ = *(undefined4 *)&(name->super_GlobalName).field_0x4;
  local_28.name = (name->super_GlobalName).name;
  Write(this,&local_28);
  return;
}

Assistant:

void CWriter::Write(const TagSymbol& name) {
  if (!IsImport(name.name)) {
    Write("&");
  }
  Write(GlobalName(name));
}